

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRightCircularCylinder::IfcRightCircularCylinder
          (IfcRightCircularCylinder *this)

{
  IfcRightCircularCylinder *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcRightCircularCylinder");
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__00f22158);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRightCircularCylinder,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRightCircularCylinder,_2UL> *)
             &(this->super_IfcCsgPrimitive3D).field_0x38,&PTR_construction_vtable_24__00f221d0);
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf220a0;
  *(undefined8 *)&this->field_0x58 = 0xf22140;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf220c8;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf220f0;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0xf22118;
  return;
}

Assistant:

IfcRightCircularCylinder() : Object("IfcRightCircularCylinder") {}